

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
polyscope::render::getAttributeBufferDataRange<unsigned_long>
          (AttributeBuffer *buff,size_t ind,size_t count)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  size_type in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  allocator_type *in_RDI;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uint32Vals;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *uint64Vals;
  allocator_type *__a;
  size_type __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type local_58;
  undefined1 local_3a [26];
  size_type local_20;
  
  __a = in_RDI;
  local_20 = in_RCX;
  (**(code **)(*in_RSI + 0x100))(local_3a + 2,in_RSI,in_RDX,in_RCX);
  local_3a[1] = 0;
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3a;
  __n = local_20;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x44e769);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this,__n,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x44e789);
  for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_3a + 2),
                        local_58);
    uVar1 = *pvVar2;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,local_58);
    *pvVar3 = (ulong)uVar1;
  }
  local_3a[1] = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<uint64_t> getAttributeBufferDataRange<uint64_t>(AttributeBuffer& buff, size_t ind, size_t count) {
  std::vector<uint32_t> uint32Vals = buff.getDataRange_uint32(ind, count);
  std::vector<uint64_t> uint64Vals(count);
  for (size_t i = 0; i < count; i++) {
    uint64Vals[i] = static_cast<uint64_t>(uint32Vals[i]);
  }
  return uint64Vals;
}